

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EndGlobalInitExpr
          (BinaryReaderInterp *this,Index index)

{
  Index IVar1;
  undefined4 uVar2;
  bool bVar3;
  Result result;
  reference pvVar4;
  GlobalDesc *global;
  Location local_128;
  Var local_108;
  Enum local_bc;
  Enum local_b8;
  Enum local_b4;
  Location local_b0;
  Var local_90;
  Enum local_48;
  Type local_44;
  Enum local_40;
  Type local_3c;
  Enum local_38;
  Type local_34;
  Enum local_30;
  Type local_2c;
  Enum local_28;
  Type local_24;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = index;
  pBStack_18 = this;
  switch((this->init_expr_).kind) {
  case I32:
    Type::Type(&local_24,I32);
    local_20 = (Enum)SharedValidator::OnGlobalInitExpr_Const
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,local_24)
    ;
    bVar3 = Failed((Result)local_20);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case I64:
    Type::Type(&local_2c,I64);
    local_28 = (Enum)SharedValidator::OnGlobalInitExpr_Const
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,local_2c)
    ;
    bVar3 = Failed((Result)local_28);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case F32:
    Type::Type(&local_34,F32);
    local_30 = (Enum)SharedValidator::OnGlobalInitExpr_Const
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,local_34)
    ;
    bVar3 = Failed((Result)local_30);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case F64:
    Type::Type(&local_3c,F64);
    local_38 = (Enum)SharedValidator::OnGlobalInitExpr_Const
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,local_3c)
    ;
    bVar3 = Failed((Result)local_38);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case V128:
    Type::Type(&local_44,V128);
    local_40 = (Enum)SharedValidator::OnGlobalInitExpr_Const
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,local_44)
    ;
    bVar3 = Failed((Result)local_40);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalGet:
    IVar1 = (this->init_expr_).field_1.i32_;
    Location::Location(&local_b0);
    Var::Var(&local_90,IVar1,&local_b0);
    local_48 = (Enum)SharedValidator::OnGlobalInitExpr_GlobalGet
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_90
                               );
    bVar3 = Failed((Result)local_48);
    Var::~Var(&local_90);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefNull:
    local_b8 = (this->init_expr_).field_1.type_.enum_;
    local_b4 = (Enum)SharedValidator::OnGlobalInitExpr_RefNull
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                                (Type)local_b8);
    bVar3 = Failed((Result)local_b4);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefFunc:
    IVar1 = (this->init_expr_).field_1.i32_;
    Location::Location(&local_128);
    Var::Var(&local_108,IVar1,&local_128);
    local_bc = (Enum)SharedValidator::OnGlobalInitExpr_RefFunc
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                                &local_108);
    bVar3 = Failed((Result)local_bc);
    Var::~Var(&local_108);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  default:
    result = SharedValidator::OnGlobalInitExpr_Other
                       (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc
                       );
    bVar3 = Failed(result);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  pvVar4 = std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::back
                     (&this->module_->globals);
  uVar2 = *(undefined4 *)&(this->init_expr_).field_0x4;
  (pvVar4->init).kind = (this->init_expr_).kind;
  *(undefined4 *)&(pvVar4->init).field_0x4 = uVar2;
  (pvVar4->init).field_1.i64_ = (this->init_expr_).field_1.i64_;
  *(undefined8 *)((long)&(pvVar4->init).field_1 + 8) =
       *(undefined8 *)((long)&(this->init_expr_).field_1 + 8);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::EndGlobalInitExpr(Index index) {
  switch (init_expr_.kind) {
    case InitExprKind::I32:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::I32));
      break;

    case InitExprKind::I64:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::I64));
      break;

    case InitExprKind::F32:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::F32));
      break;

    case InitExprKind::F64:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::F64));
      break;

    case InitExprKind::V128:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Const(loc, ValueType::V128));
      break;

    case InitExprKind::GlobalGet:
      CHECK_RESULT(
          validator_.OnGlobalInitExpr_GlobalGet(loc, Var(init_expr_.index_)));
      break;

    case InitExprKind::RefNull:
      CHECK_RESULT(validator_.OnGlobalInitExpr_RefNull(loc, init_expr_.type_));
      break;

    case InitExprKind::RefFunc:
      CHECK_RESULT(
          validator_.OnGlobalInitExpr_RefFunc(loc, Var(init_expr_.index_)));
      break;

    default:
      CHECK_RESULT(validator_.OnGlobalInitExpr_Other(loc));
      break;
  }

  GlobalDesc& global = module_.globals.back();
  global.init = init_expr_;
  return Result::Ok;
}